

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

_Bool av1_compute_global_motion_disflow
                (TransformationType type,YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *ref,
                int bit_depth,int downsample_level,MotionModel *motion_models,int num_motion_models,
                _Bool *mem_alloc_failed)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  FlowField *pFVar5;
  MotionModel *motion_models_00;
  long in_RSI;
  _Bool result;
  int num_correspondences;
  Correspondence *correspondences;
  FlowField *flow;
  int src_height;
  int src_width;
  int ref_layers;
  int src_layers;
  ImagePyramid *ref_pyramid;
  CornerList *src_corners;
  ImagePyramid *src_pyramid;
  undefined6 in_stack_00000060;
  undefined1 in_stack_00000067;
  ImagePyramid *in_stack_00000068;
  int in_stack_00000074;
  ImagePyramid *in_stack_00000080;
  CornerList *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar7;
  _Bool local_1;
  
  lVar1 = *(long *)(in_RSI + 0x60);
  iVar3 = aom_compute_pyramid((YV12_BUFFER_CONFIG *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                              (int)in_stack_ffffffffffffffa8,
                              (ImagePyramid *)in_stack_ffffffffffffffa0);
  iVar4 = aom_compute_pyramid((YV12_BUFFER_CONFIG *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                              (int)in_stack_ffffffffffffffa8,
                              (ImagePyramid *)in_stack_ffffffffffffffa0);
  if ((iVar3 < 0) || (iVar4 < 0)) {
    *(undefined1 *)&flow->buf0 = 1;
    local_1 = false;
  }
  else {
    _Var2 = av1_compute_corner_list
                      ((YV12_BUFFER_CONFIG *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (int)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (_Var2) {
      uVar7 = *(undefined4 *)(*(long *)(lVar1 + 0x38) + 8);
      uVar6 = *(undefined4 *)(*(long *)(lVar1 + 0x38) + 0xc);
      pFVar5 = alloc_flow_field((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                                (int)in_stack_ffffffffffffffa8);
      if (pFVar5 == (FlowField *)0x0) {
        *(undefined1 *)&flow->buf0 = 1;
        local_1 = false;
      }
      else {
        _Var2 = compute_flow_field(in_stack_00000080,(ImagePyramid *)mem_alloc_failed,
                                   in_stack_00000074,(FlowField *)in_stack_00000068);
        if (_Var2) {
          motion_models_00 = (MotionModel *)aom_malloc(0x3a0851);
          if (motion_models_00 == (MotionModel *)0x0) {
            *(undefined1 *)&flow->buf0 = 1;
            free_flow_field((FlowField *)0x3a0870);
            local_1 = false;
          }
          else {
            iVar3 = determine_disflow_correspondence
                              (in_stack_00000068,
                               (ImagePyramid *)
                               CONCAT17(in_stack_00000067,CONCAT16(type,in_stack_00000060)),
                               (CornerList *)src,(FlowField *)ref,
                               (Correspondence *)CONCAT44(bit_depth,downsample_level));
            local_1 = ransac((Correspondence *)CONCAT44(uVar7,uVar6),(int)((ulong)pFVar5 >> 0x20),
                             (TransformationType)((ulong)pFVar5 >> 0x18),motion_models_00,iVar3,
                             (_Bool *)0x3a08bd);
            aom_free(motion_models_00);
            free_flow_field((FlowField *)0x3a08d7);
          }
        }
        else {
          *(undefined1 *)&flow->buf0 = 1;
          free_flow_field((FlowField *)0x3a0835);
          local_1 = false;
        }
      }
    }
    else {
      *(undefined1 *)&flow->buf0 = 1;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool av1_compute_global_motion_disflow(
    TransformationType type, YV12_BUFFER_CONFIG *src, YV12_BUFFER_CONFIG *ref,
    int bit_depth, int downsample_level, MotionModel *motion_models,
    int num_motion_models, bool *mem_alloc_failed) {
  // Precompute information we will need about each frame
  ImagePyramid *src_pyramid = src->y_pyramid;
  CornerList *src_corners = src->corners;
  ImagePyramid *ref_pyramid = ref->y_pyramid;

  const int src_layers =
      aom_compute_pyramid(src, bit_depth, DISFLOW_PYRAMID_LEVELS, src_pyramid);
  const int ref_layers =
      aom_compute_pyramid(ref, bit_depth, DISFLOW_PYRAMID_LEVELS, ref_pyramid);

  if (src_layers < 0 || ref_layers < 0) {
    *mem_alloc_failed = true;
    return false;
  }
  if (!av1_compute_corner_list(src, bit_depth, downsample_level, src_corners)) {
    *mem_alloc_failed = true;
    return false;
  }

  assert(src_layers == ref_layers);

  const int src_width = src_pyramid->layers[0].width;
  const int src_height = src_pyramid->layers[0].height;
  assert(ref_pyramid->layers[0].width == src_width);
  assert(ref_pyramid->layers[0].height == src_height);

  FlowField *flow = alloc_flow_field(src_width, src_height);
  if (!flow) {
    *mem_alloc_failed = true;
    return false;
  }

  if (!compute_flow_field(src_pyramid, ref_pyramid, src_layers, flow)) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  // find correspondences between the two images using the flow field
  Correspondence *correspondences =
      aom_malloc(src_corners->num_corners * sizeof(*correspondences));
  if (!correspondences) {
    *mem_alloc_failed = true;
    free_flow_field(flow);
    return false;
  }

  const int num_correspondences = determine_disflow_correspondence(
      src_pyramid, ref_pyramid, src_corners, flow, correspondences);

  bool result = ransac(correspondences, num_correspondences, type,
                       motion_models, num_motion_models, mem_alloc_failed);

  aom_free(correspondences);
  free_flow_field(flow);
  return result;
}